

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_toolbar.cpp
# Opt level: O0

void QtMWidgets::ToolBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  QSize *pQVar3;
  Orientation OVar4;
  Alignment AVar5;
  QMetaType QVar6;
  QSize QVar7;
  void *_v_1;
  ToolBar *_t_2;
  void *_v;
  ToolBar *_t_1;
  int *result;
  QMetaType local_40;
  QMetaType local_38;
  Int local_2c;
  QObject *local_28;
  ToolBar *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (ToolBar *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    switch(_id) {
    case 0:
      actionTriggered((ToolBar *)_o,*_a[1]);
      break;
    case 1:
      orientationChanged((ToolBar *)_o,*_a[1]);
      break;
    case 2:
      iconSizeChanged((ToolBar *)_o,(QSize *)_a[1]);
      break;
    case 3:
      setIconSize((ToolBar *)_o,(QSize *)_a[1]);
      break;
    case 4:
      local_2c = *_a[1];
      setAlignment((ToolBar *)_o,(Alignment)local_2c);
      break;
    case 5:
      setOrientation((ToolBar *)_o,*_a[1]);
      break;
    case 6:
      _q_leftArrowClicked((ToolBar *)_o);
      break;
    case 7:
      _q_rightArrowClicked((ToolBar *)_o);
    }
  }
  else if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 0) {
      if (*_a[1] == 0) {
        QVar6 = QMetaType::fromType<QAction*>();
        **(undefined8 **)_t = QVar6.d_ptr;
      }
      else {
        memset(&local_40,0,8);
        QMetaType::QMetaType(&local_40);
        **(undefined8 **)_t = local_40.d_ptr;
      }
    }
    else {
      memset(&local_38,0,8);
      QMetaType::QMetaType(&local_38);
      **(undefined8 **)_t = local_38.d_ptr;
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == actionTriggered && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == orientationChanged && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)
         ) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == iconSizeChanged && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0))
        {
          *puVar1 = 2;
        }
      }
    }
  }
  else if (_c == ReadProperty) {
    pQVar3 = (QSize *)*_a;
    if (_id == 0) {
      OVar4 = orientation((ToolBar *)_o);
      pQVar3->wd = OVar4;
    }
    else if (_id == 1) {
      QVar7 = iconSize((ToolBar *)_o);
      *pQVar3 = QVar7;
    }
    else if (_id == 2) {
      AVar5 = alignment((ToolBar *)_o);
      pQVar3->wd = AVar5.i;
    }
  }
  else if (_c == WriteProperty) {
    pQVar3 = (QSize *)*_a;
    if (_id == 0) {
      setOrientation((ToolBar *)_o,pQVar3->wd);
    }
    else if (_id == 1) {
      setIconSize((ToolBar *)_o,pQVar3);
    }
    else if (_id == 2) {
      setAlignment((ToolBar *)_o,(Alignment)pQVar3->wd);
    }
  }
  return;
}

Assistant:

void QtMWidgets::ToolBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ToolBar *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->actionTriggered((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 1: _t->orientationChanged((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1]))); break;
        case 2: _t->iconSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 3: _t->setIconSize((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 4: _t->setAlignment((*reinterpret_cast< std::add_pointer_t<Qt::Alignment>>(_a[1]))); break;
        case 5: _t->setOrientation((*reinterpret_cast< std::add_pointer_t<Qt::Orientation>>(_a[1]))); break;
        case 6: _t->_q_leftArrowClicked(); break;
        case 7: _t->_q_rightArrowClicked(); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (ToolBar::*)(QAction * );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ToolBar::actionTriggered)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (ToolBar::*)(Qt::Orientation );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ToolBar::orientationChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (ToolBar::*)(const QSize & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ToolBar::iconSizeChanged)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<ToolBar *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< Qt::Orientation*>(_v) = _t->orientation(); break;
        case 1: *reinterpret_cast< QSize*>(_v) = _t->iconSize(); break;
        case 2: *reinterpret_cast< Qt::Alignment*>(_v) = _t->alignment(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<ToolBar *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrientation(*reinterpret_cast< Qt::Orientation*>(_v)); break;
        case 1: _t->setIconSize(*reinterpret_cast< QSize*>(_v)); break;
        case 2: _t->setAlignment(*reinterpret_cast< Qt::Alignment*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}